

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O1

void __thiscall pzgeom::TPZArc3D::TPZArc3D(TPZArc3D *this,TPZArc3D *cp,TPZGeoMesh *param_2)

{
  double *pdVar1;
  int64_t iVar2;
  REAL RVar3;
  
  (this->super_TPZNodeRep<3,_pztopology::TPZLine>).super_TPZLine.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZNodeRep_018d40c0;
  iVar2 = (cp->super_TPZNodeRep<3,_pztopology::TPZLine>).fNodeIndexes[1];
  (this->super_TPZNodeRep<3,_pztopology::TPZLine>).fNodeIndexes[0] =
       (cp->super_TPZNodeRep<3,_pztopology::TPZLine>).fNodeIndexes[0];
  (this->super_TPZNodeRep<3,_pztopology::TPZLine>).fNodeIndexes[1] = iVar2;
  (this->super_TPZNodeRep<3,_pztopology::TPZLine>).fNodeIndexes[2] =
       (cp->super_TPZNodeRep<3,_pztopology::TPZLine>).fNodeIndexes[2];
  (this->super_TPZNodeRep<3,_pztopology::TPZLine>).super_TPZLine.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZArc3D_018d4038;
  pdVar1 = (this->fICnBase).fBuf;
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive
       = '\0';
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  (this->fICnBase).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fICnBase).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fICnBase).super_TPZFMatrix<double>.fSize = 9;
  TPZVec<int>::TPZVec(&(this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fICnBase).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fICnBase).super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0
  ;
  (this->fICnBase).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fICnBase).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fICnBase).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fICnBase).super_TPZFMatrix<double>.fElem = (double *)0x0;
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  pdVar1 = (this->fIBaseCn).fBuf;
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive
       = '\0';
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fIBaseCn).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fIBaseCn).super_TPZFMatrix<double>.fSize = 9;
  TPZVec<int>::TPZVec(&(this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0
  ;
  (this->fIBaseCn).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fElem = (double *)0x0;
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZManVector<double,_3>::TPZManVector(&this->fCenter3D,0);
  TPZManVector<double,_3>::TPZManVector(&this->finitialVector,0);
  TPZFMatrix<double>::operator=
            (&(this->fICnBase).super_TPZFMatrix<double>,&(cp->fICnBase).super_TPZFMatrix<double>);
  TPZFMatrix<double>::operator=
            (&(this->fIBaseCn).super_TPZFMatrix<double>,&(cp->fIBaseCn).super_TPZFMatrix<double>);
  TPZManVector<double,_3>::operator=(&this->fCenter3D,&cp->fCenter3D);
  TPZManVector<double,_3>::operator=(&this->finitialVector,&cp->finitialVector);
  RVar3 = cp->fRadius;
  this->fAngle = cp->fAngle;
  this->fRadius = RVar3;
  RVar3 = cp->fYcenter;
  this->fXcenter = cp->fXcenter;
  this->fYcenter = RVar3;
  return;
}

Assistant:

TPZArc3D(const TPZArc3D &cp, TPZGeoMesh &) : TPZRegisterClassId(&TPZArc3D::ClassId),
        pzgeom::TPZNodeRep<NNodes, pztopology::TPZLine>(cp){
			this->fICnBase  = cp.fICnBase;
			this->fIBaseCn  = cp.fIBaseCn;
			this->fCenter3D = cp.fCenter3D;
            this->finitialVector = cp.finitialVector;
			this->fRadius   = cp.fRadius;
            this->fAngle = cp.fAngle;
            this->fXcenter = cp.fXcenter;
            this->fYcenter = cp.fYcenter;
		}